

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPCMacAlgorithm.cpp
# Opt level: O2

bool __thiscall OSSLEVPCMacAlgorithm::verifyFinal(OSSLEVPCMacAlgorithm *this,ByteString *signature)

{
  CMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uchar *out;
  size_t outLen;
  ByteString macResult;
  
  bVar1 = MacAlgorithm::verifyFinal(&this->super_MacAlgorithm,signature);
  if (bVar1) {
    ByteString::ByteString(&macResult);
    iVar2 = (*(this->super_MacAlgorithm)._vptr_MacAlgorithm[0xb])(this);
    outLen = CONCAT44(extraout_var,iVar2);
    ByteString::resize(&macResult,outLen);
    ctx = (CMAC_CTX *)this->curCTX;
    out = ByteString::operator[](&macResult,0);
    iVar2 = CMAC_Final(ctx,out,&outLen);
    if (iVar2 == 0) {
      softHSMLog(3,"verifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                 ,0xe8,"CMAC_Final failed");
      CMAC_CTX_free((CMAC_CTX *)this->curCTX);
      this->curCTX = (CMAC_CTX *)0x0;
      bVar1 = false;
    }
    else {
      CMAC_CTX_free((CMAC_CTX *)this->curCTX);
      this->curCTX = (CMAC_CTX *)0x0;
      bVar1 = ByteString::operator==(&macResult,signature);
    }
    ByteString::~ByteString(&macResult);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OSSLEVPCMacAlgorithm::verifyFinal(ByteString& signature)
{
	if (!MacAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString macResult;
	size_t outLen = getMacSize();
	macResult.resize(outLen);

	if (!CMAC_Final(curCTX, &macResult[0], &outLen))
	{
		ERROR_MSG("CMAC_Final failed");

		CMAC_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	CMAC_CTX_free(curCTX);
	curCTX = NULL;

	return macResult == signature;
}